

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::map_slot_policy<int,std::__cxx11::string>::
     construct<std::allocator<std::pair<int_const,std::__cxx11::string>>,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>>
               (allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,tuple<int_&&> *args_1,
               tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_2)

{
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_local_2;
  tuple<int_&&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alloc_local;
  
  map_slot_policy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::emplace(slot);
  std::allocator_traits<std::allocator<std::pair<int_const,std::__cxx11::string>>>::
  construct<std::pair<int,std::__cxx11::string>,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>>
            (alloc,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }